

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Link.cpp
# Opt level: O0

TShHandleBase * ConstructLinker(EShExecutable executable,int param_2)

{
  TGenericLinker *this;
  int param_1_local;
  EShExecutable executable_local;
  
  this = (TGenericLinker *)operator_new(0xa8);
  TGenericLinker::TGenericLinker(this,executable);
  return (TShHandleBase *)this;
}

Assistant:

TShHandleBase* ConstructLinker(EShExecutable executable, int) { return new TGenericLinker(executable); }